

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_settypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer typetag)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQUserPointer in_RDX;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pSVar2 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (SQInteger)in_stack_ffffffffffffffc8);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    ((pSVar2->super_SQObject)._unVal.pClass)->_typetag = in_RDX;
  }
  else {
    if (SVar1 != OT_USERDATA) {
      SVar3 = sq_throwerror((HSQUIRRELVM)CONCAT44(SVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
      return SVar3;
    }
    ((pSVar2->super_SQObject)._unVal.pTable)->_numofnodes = (SQInteger)in_RDX;
  }
  return 0;
}

Assistant:

SQRESULT sq_settypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    switch(type(o)) {
        case OT_USERDATA:   _userdata(o)->_typetag = typetag;   break;
        case OT_CLASS:      _class(o)->_typetag = typetag;      break;
        default:            return sq_throwerror(v,_SC("invalid object type"));
    }
    return SQ_OK;
}